

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ufs.c
# Opt level: O0

int unixpathname(char *src,char *dst,int versionp,int genp)

{
  char cVar1;
  int iVar2;
  __uid_t __uid;
  ulong uVar3;
  char *pcVar4;
  int *piVar5;
  passwd *ppVar6;
  bool bVar7;
  char *local_30e0;
  char *lfn_cp;
  char lv_ver_buf [16];
  char *pcStack_30c0;
  uint lv_ver;
  char *lv_vp;
  char *lv_cp;
  passwd *pwd;
  char ver2 [16];
  char ver1 [16];
  char fbuf2 [4096];
  char fbuf1 [4096];
  char lfname [4096];
  char name [64];
  char *pcStack_40;
  int newdirflg;
  char *np;
  char *dp;
  char *cp;
  int genp_local;
  int versionp_local;
  char *dst_local;
  char *src_local;
  
  iVar2 = strcmp(src,"<");
  if (iVar2 == 0) {
    strcpy(dst,"/");
    return 1;
  }
  strcpy(fbuf1 + 0xff8,src);
  if (versionp != 0) {
    lv_vp = fbuf1 + 0xff8;
    pcStack_30c0 = (char *)0x0;
    while (*lv_vp != '\0') {
      if (*lv_vp == '\'') {
        if (lv_vp[1] == '\0') {
          lv_vp = lv_vp + 1;
        }
        else {
          lv_vp = lv_vp + 2;
        }
      }
      else if (*lv_vp == ';') {
        pcStack_30c0 = lv_vp;
        lv_vp = lv_vp + 1;
      }
      else {
        lv_vp = lv_vp + 1;
      }
    }
    if (pcStack_30c0 != (char *)0x0) {
      if (pcStack_30c0[1] == '\0') {
        *pcStack_30c0 = '\0';
      }
      else {
        local_30e0 = pcStack_30c0;
        if (pcStack_30c0[1] != '\0') {
          do {
            local_30e0 = local_30e0 + 1;
            if (*local_30e0 == '\0') {
              uVar3 = strtoul(pcStack_30c0 + 1,(char **)0x0,10);
              lv_ver_buf._12_4_ = (undefined4)uVar3;
              if (lv_ver_buf._12_4_ == 0) {
                *pcStack_30c0 = '\0';
              }
              else {
                sprintf((char *)&lfn_cp,".~%u~",uVar3 & 0xffffffff);
                *pcStack_30c0 = '\0';
                strcat(fbuf1 + 0xff8,(char *)&lfn_cp);
              }
              goto LAB_0015cfd5;
            }
          } while (('/' < *local_30e0) && (*local_30e0 < ':'));
        }
        strcpy((char *)&lfn_cp,pcStack_30c0 + 1);
        strcat((char *)&lfn_cp,"~");
        *pcStack_30c0 = '.';
        pcStack_30c0[1] = '~';
        pcStack_30c0[2] = '\0';
        strcat(fbuf1 + 0xff8,(char *)&lfn_cp);
      }
    }
  }
LAB_0015cfd5:
  dp = fbuf1 + 0xff8;
  np = dst;
  if (fbuf1[0xff8] == '.') {
    if (fbuf1[0xff9] == '\0') {
      pcVar4 = getcwd(dst,0x1000);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      for (; *np != '\0'; np = np + 1) {
      }
      *np = '/';
      dp = fbuf1 + 0xff9;
      np = np + 1;
    }
    else if (fbuf1[0xff9] == '.') {
      if ((fbuf1[0xffa] == '>') || (fbuf1[0xffa] == '\0')) {
        pcVar4 = getcwd(dst,0x1000);
        if (pcVar4 == (char *)0x0) {
          return 0;
        }
        pcVar4 = strrchr(dst,0x2f);
        np = pcVar4 + 1;
        if (fbuf1[0xffa] == '\0') {
          dp = fbuf1 + 0xffa;
        }
        else {
          dp = fbuf1 + 0xffb;
        }
      }
      else {
        np = dst + 1;
        *dst = '/';
      }
    }
    else if (fbuf1[0xff9] == '>') {
      pcVar4 = getcwd(dst,0x1000);
      if (pcVar4 == (char *)0x0) {
        return 0;
      }
      for (; *np != '\0'; np = np + 1) {
      }
      *np = '/';
      dp = fbuf1 + 0xffa;
      np = np + 1;
    }
    else {
      *dst = '/';
      np = dst + 1;
    }
  }
  else if (fbuf1[0xff8] == '~') {
    if ((fbuf1[0xff9] == '>') || (fbuf1[0xff9] == '\0')) {
      alarm(TIMEOUT_TIME);
      do {
        piVar5 = __errno_location();
        *piVar5 = 0;
        __uid = getuid();
        ppVar6 = getpwuid(__uid);
        bVar7 = false;
        if (ppVar6 == (passwd *)0x0) {
          piVar5 = __errno_location();
          bVar7 = *piVar5 == 4;
        }
      } while (bVar7);
      alarm(0);
      if (ppVar6 == (passwd *)0x0) {
        return 0;
      }
      strcpy(dst,ppVar6->pw_dir);
      for (; *np != '\0'; np = np + 1) {
      }
      if (np[-1] != '/') {
        *np = '/';
        np = np + 1;
      }
      if (fbuf1[0xff9] == '\0') {
        dp = fbuf1 + 0xff9;
      }
      else {
        dp = fbuf1 + 0xffa;
      }
    }
    else {
      pcStack_40 = lfname + 0xff8;
      dp = fbuf1 + 0xff9;
      while( true ) {
        bVar7 = false;
        if (*dp != '\0') {
          bVar7 = *dp != '>';
        }
        if (!bVar7) break;
        *pcStack_40 = *dp;
        pcStack_40 = pcStack_40 + 1;
        dp = dp + 1;
      }
      *pcStack_40 = '\0';
      alarm(TIMEOUT_TIME);
      do {
        piVar5 = __errno_location();
        *piVar5 = 0;
        ppVar6 = getpwnam(lfname + 0xff8);
        bVar7 = false;
        if (ppVar6 == (passwd *)0x0) {
          piVar5 = __errno_location();
          bVar7 = *piVar5 == 4;
        }
      } while (bVar7);
      alarm(0);
      if (ppVar6 == (passwd *)0x0) {
        return 0;
      }
      strcpy(dst,ppVar6->pw_dir);
      for (; *np != '\0'; np = np + 1) {
      }
      if (np[-1] != '/') {
        *np = '/';
        np = np + 1;
      }
      if (*dp == '>') {
        dp = dp + 1;
      }
    }
  }
  else {
    *dst = '/';
    np = dst + 1;
  }
  bVar7 = true;
  while (*dp != '\0') {
    if (bVar7) {
      if (*dp == '\'') {
        *np = dp[1];
        bVar7 = false;
        np = np + 1;
        dp = dp + 2;
      }
      else if (*dp == '.') {
        cVar1 = dp[1];
        if (cVar1 == '\0') {
          dp = dp + 1;
        }
        else if (cVar1 == '.') {
          if ((dp[2] == '>') || (dp[2] == '\0')) {
            if (np + -1 != dst) {
              for (np = np + -2; *np != '/'; np = np + -1) {
              }
              np = np + 1;
            }
            if (dp[2] == '\0') {
              dp = dp + 2;
            }
            else {
              dp = dp + 3;
            }
          }
          else {
            dp = dp + 1;
            bVar7 = false;
          }
        }
        else if (cVar1 == '>') {
          dp = dp + 2;
        }
        else {
          *np = *dp;
          bVar7 = false;
          np = np + 1;
          dp = dp + 1;
        }
      }
      else {
        *np = *dp;
        bVar7 = false;
        np = np + 1;
        dp = dp + 1;
      }
    }
    else if (*dp == '\'') {
      dp = dp + 2;
    }
    else if (*dp == '>') {
      *np = '/';
      bVar7 = true;
      np = np + 1;
      dp = dp + 1;
    }
    else {
      *np = *dp;
      np = np + 1;
      dp = dp + 1;
    }
  }
  *np = '\0';
  if ((!bVar7) && (genp == 0)) {
    strcpy(fbuf2 + 0xff8,fbuf1 + 0xff8);
    strcpy(ver1 + 8,dst);
    separate_version(fbuf2 + 0xff8,ver2 + 8,1);
    separate_version(ver1 + 8,(char *)&pwd,1);
    for (dp = fbuf2 + 0xff8; *dp != '\0'; dp = dp + 1) {
    }
    for (np = ver1 + 8; *np != '\0'; np = np + 1) {
    }
    if ((dp[-1] == '.') && ((dp[-2] != '\'' || ((fbuf2 + 0xff8 < dp + -3 && (dp[-3] == '\'')))))) {
      np[-1] = '\0';
    }
    if ((char)pwd == '\0') {
      strcpy(dst,ver1 + 8);
    }
    else {
      strcpy(dst,ver1 + 8);
      strcat(dst,".~");
      strcat(dst,(char *)&pwd);
      strcat(dst,"~");
    }
  }
  return 1;
}

Assistant:

int unixpathname(char *src, char *dst, int versionp, int genp)
#endif /* DOS */
{
  char *cp, *dp, *np;
  int newdirflg;
  char name[64];
  char lfname[MAXPATHLEN], fbuf1[MAXPATHLEN], fbuf2[MAXPATHLEN];
  char ver1[VERSIONLEN], ver2[VERSIONLEN];
  struct passwd *pwd;

#ifdef DOS
  char *rp;
  int namelen = 0, extlen = 0; /* lengths of name & extension */
  int extensionp = 0;          /* T if we're in the extension */
  int version = 1;             /* version # for this file */
#endif                         /* DOS */

/* If there's a drive letter, it and a colon come first */
#ifdef DOS
  if (drive && (*drive)) {
    *dst++ = *drive;
    *dst++ = DRIVESEP;
  }
#endif /* DOS */

  /*
   * The UNIX root directory is represented as "<" in Xerox Lisp generic
   * file system code.
   */
  if (strcmp(src, "<") == 0) {
    strcpy(dst, DIRSEPSTR);
    return (1);
  }

  /* Copy src to protect it from destructive modification. */
  strcpy(lfname, src);

/*
 * If versionp is specified, we have to deal with the version field first,
 * because the quotation mark which quotes the semicolon might be lost
 * in the course of the following conversion.
 */
#ifdef DOS
  if (versionp) LispVersionToUnixVersion(lfname, version); else version = -1;
#else
  if (versionp) LispVersionToUnixVersion(lfname);
#endif /* DOS */

  cp = lfname;
  dp = dst;

  /*
   * We have to deal with the case in which the pathname is started with
   * the meta character ('.', '~').
   */

  switch (*cp) {
    case '.':
      switch (*(cp + 1)) {
        case '.':
          if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
            /*
             * "..>" or ".." means the parent directory of the
             * user's current working directory.
             */
            if (getcwd(dst, MAXPATHLEN) == 0) return (0);
#ifdef DOS
            dp = max(strrchr(dst, '/'), strrchr(dst, DIRSEP));
#else
            dp = strrchr(dst, '/');
#endif /* DOS */

            dp++;
            if (*(cp + 2) == '\0')
              cp += 2;
            else
              cp += 3;
          } else {
            /* Insert the initial directory delimiter. */
            *dp++ = DIRSEP;
          }
          break;
#ifdef DOS
        case '/':
        case DIRSEP:
#endif
        case '>':
          /* ".>" means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp += 2;
          break;

        case '\0':
          /* "." also means the user's current working directory. */
          if (getcwd(dst, MAXPATHLEN) == 0) return (0);
          while (*dp != '\0') dp++;

          *dp++ = DIRSEP;
          cp++;
          break;

        default:
          /* Insert the initial directory delimiter. */
          *dp++ = DIRSEP;
          break;
      }
      break;
#ifndef DOS
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */
        TIMEOUT0(pwd = getpwuid(getuid()));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *np = '\0';
        TIMEOUT0(pwd = getpwnam(name));
        if (pwd == NULL) return (0);

        strcpy(dst, pwd->pw_dir);
        while (*dp != '\0') dp++;
        if (*(dp - 1) != DIRSEP) {
          /*
           * Usually system administrators specify the users'
           * home directories in the /etc/passwd without
           * the trail directory delimiter.
           */
          *dp++ = DIRSEP;
        }

        if (*cp == '>') cp++;
      }
      break;

#else
    /* For DOS, ignore ~> or ~/ or ~ */
    case '~':
      if (*(cp + 1) == '>' || *(cp + 1) == '\0') {
        /* "~>" or "~" means the user's home directory. */

        *dp++ = DIRSEP;
        if (*(cp + 1) == '\0')
          cp++;
        else
          cp += 2;
      } else {
        /*
         * In this case, we assume some user's home directory
         * is specified in the form "~username".
         */
        for (++cp, np = name; *cp != '\0' && *cp != '>';) *np++ = *cp++;
        *dp++ = DIRSEP;

        if (*cp == '>') cp++;
      }
      break;

#endif /* DOS */
    default:
      *dp++ = '/'; /* Insert the initial directory delimiter. */
      break;
  }

  /*
   * At this point, cp is placed at the point from which the source pathname
   * will be scanned, and dp is placed at the point on dst from which the
   * pathname will be copied.
   */

  newdirflg = 1;
  while (*cp != '\0') {
    if (newdirflg) {
      /*
       * The new directory component starts.  We have to care about
       * the meta characters again.  This time, the tilde character
       * has no special meaning.
       */
      switch (*cp) {
        case '.':
          switch (*(cp + 1)) {
            case '.':
              /* "..>" or ".." */
              if (*(cp + 2) == '>' || *(cp + 2) == '\0') {
                /*
                 * We have to check if we have already
                 * backed to the root directory or not.
                 */
                if ((dp - 1) != dst) {
                  /*
                   * We are not at the root
                   * directory.  Back to the
                   * parent directory.
                   */
                  for (dp -= 2; *dp != '/'; dp--) {}
                  dp++;
                }
                if (*(cp + 2) == '\0')
                  cp += 2;
                else
                  cp += 3;
              } else {
                /*
                 * (IL:DIRECTORY "{DSK}.") is translated
                 * as (IL:DIRECTORY "{DSK}~>.;*").
                 * The Lisp directory is translated as
                 * like "/users/akina/..~*~" by
                 * unixpathname.   Although such
                 * file name representation makes no sense,
                 * to avoid infinite loop, skip the
                 * first period here, as well as down
                 * a newdirflg.
                 */
                cp++;
                newdirflg = 0;
              }
              break;

            case '>':
              /* ".>" */
              cp += 2;
              break;

            case '\0':
              /* "." */
              cp++;
              break;

            default:
              *dp++ = *cp++;
              newdirflg = 0;
              break;
          }
          break;

        case '\'':
          /*
           * The first character of the new directory component
           * is a quotation mark which is the quote character
           * in the Xerox Lisp file naming convention.  Copy the
           * next character and skip the quoted character.
           */
          *dp++ = *(cp + 1);
          cp += 2;
          newdirflg = 0;
          break;

        default:
          *dp++ = *cp++;
          newdirflg = 0;
          break;
      }
    } else {
      switch (*cp) {
#ifdef DOS
        case '/': /* in DOS, must xlate / also. */
#endif            /* DOS */
        case '>':
          /*
           * Xerox Lisp directory delimiter '>' is translated into
           * UNIX one, '/'.
           */
          *dp = DIRSEP;
          dp++;
          cp++;
          newdirflg = 1; /* Turn on the new directory flag. */
#ifdef DOS
          namelen = extlen = 0;
          rp = dp; /* remember where raw filename starts */
#endif             /* DOS */
          break;

        case '\'':
/*
 * The special characters in the Xerox Lisp file naming
 * convention are quoted with the quote character.
 * They are all valid in the UNIX file naming convention.
 * So only we have to do is to skip the quotation mark
 * and copy the next character.
 */
#ifdef DOS
          if (NameValid) *dp++ = *(cp + 1);
          CountNameChars;
#endif /* DOS */
          cp += 2;
          break;
#ifdef DOS
        case '.': /* start of extension, if not already */
          if (!extensionp)
            *dp++ = *cp++;
          else
            cp++;
          extensionp = 1;
          break;
#endif /* DOS */
        default:
          if (NameValid)
            *dp++ = *cp++;
          else
            cp++;
          CountNameChars;
          break;
      }
    }
  }
  *dp = '\0';
  if (!newdirflg && !genp) {
    /*
     * If the last character in dst is a period, it has to be handled
     * specially, because it might be used to specify that src has no
     * extension field.  This case can be distinguished by examining the
     * character just before the period.
     * If the specified pathname is one like "~>..", the last meta character
     * matches this case.  Thus we check newdirflg first so as not to be
     * confused by this case.
     *
     * Only case in which genp is 1 is unixpathname is used to convert
     * a pattern which is used to enumerate directory.  In this case,
     * for the convenience of the pattern matching routines, we don't
     * care about the last period character.
     */
    strcpy(fbuf1, lfname);
    strcpy(fbuf2, dst);
    separate_version(fbuf1, ver1, 1);
    separate_version(fbuf2, ver2, 1);
    for (cp = fbuf1; *cp; cp++) {}
    for (dp = fbuf2; *dp; dp++) {}
    if (*(cp - 1) == '.') {
      if (*(cp - 2) != '\'' || ((cp - 3) > fbuf1 && *(cp - 3) == '\'')) {
        /*
         * The last period is not been quoted.  It is used
         * to specify the no extension case.  We have to
         * omit this period.
         */
        *(dp - 1) = '\0';
      }
    }
#ifdef DOS
    if (version >= 0)
      sprintf(ver2, "%d", version);
    else
      *ver2 = '\0';
#endif /* DOS */
    ConcNameAndVersion(fbuf2, ver2, dst);
  }
  return (1);
}